

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

string * GenerateId_abi_cxx11_(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  time_t tVar9;
  string *in_RDI;
  allocator local_69;
  char local_68 [8];
  char str_uuid [80];
  
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  uVar1 = rand();
  uVar2 = rand();
  uVar3 = rand();
  uVar4 = rand();
  iVar5 = rand();
  iVar6 = rand();
  iVar7 = rand();
  iVar8 = rand();
  snprintf(local_68,0x50,"%x%x-%x-%x-%x-%x%x%x",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
           uVar4 & 0xfff | 0x4000,iVar5 + 0x8000 + (iVar5 / 0x3fff) * -0x3fff,iVar6,iVar7,iVar8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_68,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return in_RDI;
}

Assistant:

std::string GenerateId() {
    char str_uuid[80];
    srand(time(NULL));
    snprintf(str_uuid, sizeof(str_uuid),
             "%x%x-%x-%x-%x-%x%x%x",
             rand(),
             rand(),
             rand(),
             ((rand() & 0x0fff) | 0x4000),
             rand() % 0x3fff + 0x8000,
             rand(),
             rand(),
             rand());
    return str_uuid;
}